

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O0

void nes_system_read_memory
               (nes_system *system,nes_memory_type memory_type,uint16_t address,void *buffer,
               size_t buffer_size)

{
  undefined1 uVar1;
  ushort local_32;
  code *pcStack_30;
  uint16_t i;
  _func_uint8_t_nes_system_ptr_uint16_t *read_byte;
  size_t buffer_size_local;
  void *buffer_local;
  uint16_t address_local;
  nes_memory_type memory_type_local;
  nes_system *system_local;
  
  pcStack_30 = (code *)0x0;
  if (memory_type == NES_MEMORY_TYPE_CPU) {
    pcStack_30 = nes_system_read_cpu_byte;
  }
  else if (memory_type == NES_MEMORY_TYPE_PPU) {
    pcStack_30 = nes_system_read_ppu_byte;
  }
  else if (memory_type == NES_MEMORY_TYPE_OAM) {
    pcStack_30 = nes_system_read_oam_byte;
  }
  if (pcStack_30 != (code *)0x0) {
    for (local_32 = 0; local_32 < buffer_size; local_32 = local_32 + 1) {
      uVar1 = (*pcStack_30)(system,(short)((uint)address + (uint)local_32),local_32,
                            (uint)address + (uint)local_32);
      *(undefined1 *)((long)buffer + (long)(int)(uint)local_32) = uVar1;
    }
  }
  return;
}

Assistant:

void nes_system_read_memory(nes_system* system, nes_memory_type memory_type, uint16_t address, void* buffer, size_t buffer_size)
{
    uint8_t (*read_byte)(nes_system*, uint16_t) = 0;
    switch (memory_type)
    {
        case NES_MEMORY_TYPE_CPU : read_byte = nes_system_read_cpu_byte; break;
        case NES_MEMORY_TYPE_PPU : read_byte = nes_system_read_ppu_byte; break;
        case NES_MEMORY_TYPE_OAM : read_byte = nes_system_read_oam_byte; break;
        default: break;
    }

    if (!read_byte)
        return;

    for (uint16_t i = 0; i < buffer_size; ++i)
        *((uint8_t*)buffer + i) = read_byte(system, address + i);
}